

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall SQClass::SQClass(SQClass *this,SQSharedState *ss,SQClass *base)

{
  SQUnsignedInteger *pSVar1;
  SQInteger SVar2;
  long lVar3;
  SQTable *pSVar4;
  EVP_PKEY_CTX *src;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_0013aee0;
  (this->_defaultvalues)._vals = (SQClassMember *)0x0;
  (this->_defaultvalues)._size = 0;
  (this->_defaultvalues)._allocated = 0;
  (this->_methods)._vals = (SQClassMember *)0x0;
  (this->_methods)._size = 0;
  (this->_methods)._allocated = 0;
  lVar3 = 0x78;
  do {
    *(undefined4 *)((long)this->_metamethods + lVar3 + -0x78) = 0x1000001;
    *(undefined8 *)
     ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
             _vptr_SQRefCounted + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x198);
  (this->_attributes).super_SQObject._type = OT_NULL;
  (this->_attributes).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_base = base;
  this->_udsize = 0;
  this->_typetag = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  this->_locked = false;
  this->_constructoridx = -1;
  if (base == (SQClass *)0x0) {
    pSVar4 = SQTable::Create(ss,0);
  }
  else {
    SVar2 = base->_udsize;
    this->_constructoridx = base->_constructoridx;
    this->_udsize = SVar2;
    sqvector<SQClassMember>::copy
              (&this->_defaultvalues,(EVP_PKEY_CTX *)&base->_defaultvalues,(EVP_PKEY_CTX *)base);
    sqvector<SQClassMember>::copy(&this->_methods,(EVP_PKEY_CTX *)&base->_methods,src);
    for (lVar3 = 0x70; lVar3 != 400; lVar3 = lVar3 + 0x10) {
      SQObjectPtr::operator=
                ((SQObjectPtr *)
                 ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                         super_SQRefCounted._vptr_SQRefCounted + lVar3),
                 (SQObjectPtr *)
                 ((long)&(((SQClass *)(base->_metamethods + -7))->super_SQCollectable).
                         super_SQRefCounted._vptr_SQRefCounted + lVar3));
    }
    pSVar1 = &(this->_base->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar4 = SQTable::Clone(base->_members);
  }
  this->_members = pSVar4;
  pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQClass::SQClass(SQSharedState *ss,SQClass *base)
{
    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _locked = false;
    _constructoridx = -1;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_LAST);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}